

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gguf.cpp
# Opt level: O3

size_t gguf_get_arr_n(gguf_context *ctx,int64_t key_id)

{
  gguf_type gVar1;
  pointer pgVar2;
  ulong uVar3;
  char *pcVar4;
  long lVar5;
  _Base_ptr p_Var6;
  int line;
  _Base_ptr p_Var7;
  
  if ((key_id < 0) ||
     (pgVar2 = (ctx->kv).super__Vector_base<gguf_kv,_std::allocator<gguf_kv>_>._M_impl.
               super__Vector_impl_data._M_start,
     lVar5 = ((long)(ctx->kv).super__Vector_base<gguf_kv,_std::allocator<gguf_kv>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)pgVar2 >> 3) * 0x2e8ba2e8ba2e8ba3,
     lVar5 - key_id == 0 || lVar5 < key_id)) {
    pcVar4 = "key_id >= 0 && key_id < gguf_get_n_kv(ctx)";
    line = 0x317;
    goto LAB_0013d54c;
  }
  gVar1 = pgVar2[key_id].type;
  if (gVar1 == GGUF_TYPE_STRING) {
    return (long)*(pointer *)
                  ((long)&pgVar2[key_id].data_string.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl + 8) -
           *(long *)&pgVar2[key_id].data_string.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data >> 5;
  }
  if (GGUF_TYPE_SIZE._M_t._M_impl.super__Rb_tree_header._M_header._M_parent == (_Base_ptr)0x0) {
LAB_0013d516:
    p_Var7 = (_Base_ptr)0x0;
  }
  else {
    p_Var6 = &GGUF_TYPE_SIZE._M_t._M_impl.super__Rb_tree_header._M_header;
    p_Var7 = GGUF_TYPE_SIZE._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    do {
      if ((int)gVar1 <= (int)p_Var7[1]._M_color) {
        p_Var6 = p_Var7;
      }
      p_Var7 = (&p_Var7->_M_left)[(int)p_Var7[1]._M_color < (int)gVar1];
    } while (p_Var7 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var6 == &GGUF_TYPE_SIZE._M_t._M_impl.super__Rb_tree_header) ||
       ((int)gVar1 < (int)p_Var6[1]._M_color)) goto LAB_0013d516;
    p_Var7 = p_Var6[1]._M_parent;
  }
  uVar3 = (long)*(pointer *)
                 ((long)&pgVar2[key_id].data.
                         super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl + 8)
          - *(long *)&pgVar2[key_id].data.
                      super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                      super__Vector_impl_data;
  if (uVar3 % (ulong)p_Var7 == 0) {
    return uVar3 / (ulong)p_Var7;
  }
  pcVar4 = "ctx->kv[key_id].data.size() % type_size == 0";
  line = 0x31e;
LAB_0013d54c:
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/ggml/src/gguf.cpp"
             ,line,"GGML_ASSERT(%s) failed",pcVar4);
}

Assistant:

size_t gguf_get_arr_n(const struct gguf_context * ctx, int64_t key_id) {
    GGML_ASSERT(key_id >= 0 && key_id < gguf_get_n_kv(ctx));

    if (ctx->kv[key_id].type == GGUF_TYPE_STRING) {
        return ctx->kv[key_id].data_string.size();
    }

    const size_t type_size = gguf_type_size(ctx->kv[key_id].type);
    GGML_ASSERT(ctx->kv[key_id].data.size() % type_size == 0);
    return ctx->kv[key_id].data.size() / type_size;
}